

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

void __thiscall
ggml_backend_registry::register_backend
          (ggml_backend_registry *this,ggml_backend_reg_t reg,dl_handle_ptr *handle)

{
  ggml_backend_dev_t pgVar1;
  ggml_backend_registry *in_RDX;
  long in_RSI;
  size_t i;
  value_type *in_stack_ffffffffffffffa8;
  ggml_backend_dev_t device;
  ggml_backend_dev_t local_40;
  
  if (in_RSI != 0) {
    std::unique_ptr<void,_dl_handle_deleter>::unique_ptr
              ((unique_ptr<void,_dl_handle_deleter> *)in_RDX,
               (unique_ptr<void,_dl_handle_deleter> *)in_stack_ffffffffffffffa8);
    std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::push_back
              (&in_RDX->backends,in_stack_ffffffffffffffa8);
    ggml_backend_reg_entry::~ggml_backend_reg_entry((ggml_backend_reg_entry *)0x113a93);
    local_40 = (ggml_backend_dev_t)0x0;
    while (device = local_40, pgVar1 = (ggml_backend_dev_t)ggml_backend_reg_dev_count(in_RSI),
          device < pgVar1) {
      ggml_backend_reg_dev_get(in_RSI,local_40);
      register_device(in_RDX,device);
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void register_backend(ggml_backend_reg_t reg, dl_handle_ptr handle = nullptr) {
        if (!reg) {
            return;
        }

#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: registered backend %s (%zu devices)\n",
            __func__, ggml_backend_reg_name(reg), ggml_backend_reg_dev_count(reg));
#endif
        backends.push_back({ reg, std::move(handle) });
        for (size_t i = 0; i < ggml_backend_reg_dev_count(reg); i++) {
            register_device(ggml_backend_reg_dev_get(reg, i));
        }
    }